

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_frame_buffer_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_117e0d7::ExternalFrameBufferList::SetFrameBuffer
          (ExternalFrameBufferList *this,int idx,aom_codec_frame_buffer_t *fb)

{
  ExternalFrameBuffer *pEVar1;
  internal iVar2;
  undefined8 *puVar3;
  pointer *__ptr;
  SEARCH_METHODS *pSVar4;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  AssertHelper local_40;
  internal local_38 [8];
  undefined8 *local_30;
  aom_codec_frame_buffer_t *local_28;
  
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_28 = fb;
  testing::internal::CmpHelperNE<aom_codec_frame_buffer*,decltype(nullptr)>
            (local_38,"fb","nullptr",&local_28,&local_48._M_head_impl);
  iVar2 = local_38[0];
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = (SEARCH_METHODS *)*local_30;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/external_frame_buffer_test.cc"
               ,0x97,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  puVar3 = local_30;
  if (local_30 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_30 != local_30 + 2) {
      operator_delete((undefined8 *)*local_30);
    }
    operator_delete(puVar3);
  }
  if (iVar2 != (internal)0x0) {
    pEVar1 = this->ext_fb_list_ + idx;
    local_28->data = pEVar1->data;
    local_28->size = pEVar1->size;
    local_48._M_head_impl = local_48._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,int>
              (local_38,"0","ext_fb_list_[idx].in_use",(int *)&local_48,&pEVar1->in_use);
    if (local_38[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (local_30 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_30;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/external_frame_buffer_test.cc"
                 ,0x9a,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_48._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_48._M_head_impl + 8))();
      }
    }
    if (local_30 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_30 != local_30 + 2) {
        operator_delete((undefined8 *)*local_30);
      }
      operator_delete(local_30);
    }
    if (local_38[0] != (internal)0x0) {
      pEVar1 = this->ext_fb_list_;
      pEVar1[idx].in_use = 1;
      local_28->priv = pEVar1 + idx;
    }
  }
  return;
}

Assistant:

void SetFrameBuffer(int idx, aom_codec_frame_buffer_t *fb) {
    ASSERT_NE(fb, nullptr);
    fb->data = ext_fb_list_[idx].data;
    fb->size = ext_fb_list_[idx].size;
    ASSERT_EQ(0, ext_fb_list_[idx].in_use);
    ext_fb_list_[idx].in_use = 1;
    fb->priv = &ext_fb_list_[idx];
  }